

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
Address_NoSegwitAddressFromStringTest_Test::~Address_NoSegwitAddressFromStringTest_Test
          (Address_NoSegwitAddressFromStringTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Address, NoSegwitAddressFromStringTest) {
  Address address;
  // P2PKH
  EXPECT_NO_THROW((address = Address("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn")));
  EXPECT_STREQ("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersionNone, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc")));
  EXPECT_STREQ("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());

  // regtest prefix is equals testnet prefix

  // P2SH
  EXPECT_NO_THROW((address = Address("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG")));
  EXPECT_STREQ("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());

  EXPECT_NO_THROW((address = Address("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU")));
  EXPECT_STREQ("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());

  // Illegal data
  EXPECT_THROW((address = Address("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHXfHU")),
               CfdException);
}